

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  char buffer [32];
  ulong local_78;
  char local_58 [40];
  
  pcVar15 = args->p;
  local_78 = (ulong)args->len;
  args->len = 0;
  s->start = pcVar15;
  if (0 < (long)local_78) {
    pcVar5 = pcVar15 + local_78;
    do {
      iVar8 = args->len + 7;
      iVar13 = (int)pcVar15 - (int)local_78;
      while( true ) {
        iVar13 = iVar13 + 1;
        if (args->max_len <= iVar8) {
          _lws_log(1,"Used up interpret padding\n");
          return -1;
        }
        iVar9 = s->pos;
        if ((long)iVar9 != 0) goto LAB_00134513;
        if ((iVar9 != 0) || (*pcVar15 == '$')) break;
        args->len = iVar8 + -6;
        pcVar15 = pcVar15 + 1;
        iVar8 = iVar8 + 1;
        if (pcVar5 <= pcVar15) goto LAB_001346ab;
      }
      if (iVar9 == 0) {
        s->start = pcVar15;
      }
LAB_00134513:
      cVar1 = *pcVar15;
      s->pos = iVar9 + 1;
      s->swallow[iVar9] = cVar1;
      uVar4 = s->pos;
      if ((ulong)uVar4 == 0xf) {
LAB_0013460e:
        s->swallow[(int)uVar4] = '\0';
        memcpy(s->start,s->swallow,(ulong)(uint)s->pos);
        args->len = args->len + 1;
        s->pos = 0;
        pcVar15 = s->start;
      }
      else {
        iVar8 = s->count_vars;
        if ((long)iVar8 < 1) {
          iVar9 = 0;
          iVar11 = 0;
        }
        else {
          ppcVar2 = s->vars;
          uVar14 = 0;
          uVar12 = 0;
          iVar9 = 0;
          do {
            iVar3 = strncmp(s->swallow,ppcVar2[uVar14],(ulong)uVar4);
            if (iVar3 == 0) {
              uVar12 = uVar14 & 0xffffffff;
            }
            iVar11 = (int)uVar12;
            iVar9 = iVar9 + (uint)(iVar3 == 0);
            uVar14 = uVar14 + 1;
          } while ((long)iVar8 != uVar14);
        }
        if (iVar9 == 0) goto LAB_0013460e;
        if ((iVar9 == 1) && (sVar6 = strlen(s->vars[iVar11]), uVar4 == (uint)sVar6)) {
          pcVar15 = (*s->replace)(s->data,iVar11);
          if (pcVar15 == (char *)0x0) {
            pcVar15 = "NULL";
          }
          sVar6 = strlen(pcVar15);
          s->swallow[s->pos] = '\0';
          iVar8 = (int)sVar6;
          if (s->pos != iVar8) {
            memmove(s->start + iVar8,s->start + s->pos,(ulong)(uint)(*(int *)&args->p - iVar13));
            local_78 = (ulong)((((int)local_78 + iVar8) - s->pos) + 1);
          }
          memcpy(s->start,pcVar15,sVar6 & 0xffffffff);
          args->len = args->len + 1;
          pcVar15 = s->start + 1;
          s->pos = 0;
        }
      }
      pcVar15 = pcVar15 + 1;
      pcVar5 = args->p + (int)local_78;
    } while (pcVar15 < pcVar5);
  }
LAB_001346ab:
  if (args->chunked == 0) {
    iVar8 = 0;
  }
  else if ((args->final == 0) || (iVar8 = -1, args->len + 7 < args->max_len)) {
    iVar8 = 0;
    uVar4 = sprintf(local_58,"%X\r\n",(ulong)(uint)args->len);
    pcVar15 = args->p;
    lVar10 = (long)(int)uVar4;
    args->p = pcVar15 + -lVar10;
    memcpy(pcVar15 + -lVar10,local_58,(ulong)uVar4);
    iVar13 = args->len;
    lVar7 = iVar13 + lVar10;
    args->len = (int)lVar7;
    iVar9 = args->final;
    pcVar15 = args->p;
    pcVar15[lVar7] = '\r';
    if (iVar9 == 0) {
      pcVar15[lVar7 + 1] = '\n';
      args->len = args->len + 2;
    }
    else {
      builtin_strncpy(pcVar15 + iVar13 + lVar10 + 1,"\n0\r\n\r\n",6);
      args->len = args->len + 7;
    }
  }
  return iVar8;
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], (unsigned int)s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, (unsigned int)s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						(unsigned int)(old_len - (sp - args->p) - 1));
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, (unsigned int)n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, (unsigned int)n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}